

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_utf_decode(char *c,nk_rune *u,int clen)

{
  uint i;
  ulong uVar1;
  ulong uVar2;
  nk_rune nVar3;
  long lVar4;
  bool bVar5;
  
  if (c == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x1e80,"int nk_utf_decode(const char *, nk_rune *, int)");
  }
  if (u == (nk_rune *)0x0) {
    __assert_fail("u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x1e81,"int nk_utf_decode(const char *, nk_rune *, int)");
  }
  if (clen != 0) {
    *u = 0xfffd;
    uVar2 = 0;
    do {
      if ((nk_utfmask[uVar2] & *c) == nk_utfbyte[uVar2]) {
        i = (uint)uVar2;
        uVar1 = 1;
        if (2 < i - 1) goto LAB_0011c35b;
        nVar3 = (nk_rune)(byte)(*c & ~nk_utfmask[uVar2]);
        bVar5 = uVar2 >= 2;
        if (uVar2 < 2 || clen < 2) goto LAB_0011c354;
        uVar1 = 1;
        goto LAB_0011c30a;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 5);
    uVar1 = 1;
    goto LAB_0011c35b;
  }
  goto LAB_0011c359;
  while( true ) {
    nVar3 = nVar3 << 6 | (uint)(byte)(c[uVar1] & ~nk_utfmask[lVar4]);
    uVar1 = uVar1 + 1;
    bVar5 = (uint)uVar1 < i;
    if (((uint)clen <= uVar1) || (i <= (uint)uVar1)) break;
LAB_0011c30a:
    lVar4 = 0;
    while ((nk_utfmask[lVar4] & c[uVar1]) != nk_utfbyte[lVar4]) {
      lVar4 = lVar4 + 1;
      if (lVar4 == 5) goto LAB_0011c35b;
    }
    if (lVar4 != 0) goto LAB_0011c35b;
  }
LAB_0011c354:
  if (!bVar5) {
    *u = nVar3;
    nk_utf_validate(u,i);
    uVar1 = uVar2 & 0xffffffff;
    goto LAB_0011c35b;
  }
LAB_0011c359:
  uVar1 = 0;
LAB_0011c35b:
  return (int)uVar1;
}

Assistant:

NK_API int
nk_utf_decode(const char *c, nk_rune *u, int clen)
{
    int i, j, len, type=0;
    nk_rune udecoded;

    NK_ASSERT(c);
    NK_ASSERT(u);

    if (!c || !u) return 0;
    if (!clen) return 0;
    *u = NK_UTF_INVALID;

    udecoded = nk_utf_decode_byte(c[0], &len);
    if (!NK_BETWEEN(len, 1, NK_UTF_SIZE))
        return 1;

    for (i = 1, j = 1; i < clen && j < len; ++i, ++j) {
        udecoded = (udecoded << 6) | nk_utf_decode_byte(c[i], &type);
        if (type != 0)
            return j;
    }
    if (j < len)
        return 0;
    *u = udecoded;
    nk_utf_validate(u, len);
    return len;
}